

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

BiasLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_bias(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0xfa) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0xfa;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
    BiasLayerParams::BiasLayerParams(this_00.bias_);
    (this->layer_).bias_ = (BiasLayerParams *)this_00;
  }
  return (BiasLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::BiasLayerParams* NeuralNetworkLayer::mutable_bias() {
  if (!has_bias()) {
    clear_layer();
    set_has_bias();
    layer_.bias_ = new ::CoreML::Specification::BiasLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.bias)
  return layer_.bias_;
}